

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O3

bool boost::ext::ut::v1_1_8::utility::is_match(string_view input,string_view pattern)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  size_t sVar10;
  string_view input_00;
  string_view pattern_00;
  
  pcVar9 = pattern._M_str;
  sVar10 = pattern._M_len;
  pcVar7 = input._M_str;
  uVar5 = input._M_len;
  do {
    if (sVar10 == 0) {
LAB_0010b58a:
      return uVar5 == 0;
    }
    sVar4 = 0;
    while (uVar5 == 0) {
      if (pcVar9[sVar4] != '*') {
        return false;
      }
      sVar4 = sVar4 + 1;
      if (sVar10 == sVar4) {
        uVar5 = 0;
        goto LAB_0010b58a;
      }
    }
    cVar1 = *pcVar9;
    if (cVar1 != '?') {
      if (cVar1 == '*') {
        uVar6 = 1;
        uVar8 = uVar5;
        do {
          input_00._M_str = pcVar7 + (uVar6 - 1);
          input_00._M_len = uVar8;
          pattern_00._M_str = pcVar9 + 1;
          pattern_00._M_len = sVar10 - 1;
          bVar3 = is_match(input_00,pattern_00);
          if (bVar3) {
            return bVar3;
          }
          uVar8 = uVar8 - 1;
          bVar2 = uVar6 <= uVar5;
          uVar6 = uVar6 + 1;
        } while (bVar2);
        return bVar3;
      }
      if (cVar1 != *pcVar7) {
        return false;
      }
    }
    uVar5 = uVar5 - 1;
    pcVar7 = pcVar7 + 1;
    pcVar9 = pcVar9 + 1;
    sVar10 = sVar10 - 1;
  } while( true );
}

Assistant:

[[nodiscard]] inline auto is_match(std::string_view input,
                                     std::string_view pattern) -> bool {
    if (std::empty(pattern)) {
      return std::empty(input);
    }

    if (std::empty(input)) {
      return pattern[0] == '*' ? is_match(input, pattern.substr(1)) : false;
    }

    if (pattern[0] != '?' and pattern[0] != '*' and pattern[0] != input[0]) {
      return false;
    }

    if (pattern[0] == '*') {
      for (decltype(std::size(input)) i = 0u; i <= std::size(input); ++i) {
        if (is_match(input.substr(i), pattern.substr(1))) {
          return true;
        }
      }
      return false;
    }

    return is_match(input.substr(1), pattern.substr(1));
  }